

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

statement_list * __thiscall
mjs::parser::parse_statement_list
          (statement_list *__return_storage_ptr__,parser *this,bool check_for_strict_mode)

{
  bool bVar1;
  token_type tVar2;
  statement *psVar3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  pointer puVar7;
  element_type *local_40;
  uint local_38;
  uint local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (uint)check_for_strict_mode;
  do {
    local_38 = uVar6 & 0xff;
    local_34 = uVar6 & 1;
    do {
      tVar2 = (this->current_token_).type_;
      if ((tVar2 == rbrace) || (tVar2 == eof)) {
        return __return_storage_ptr__;
      }
      bVar1 = this->strict_mode_;
      parse_statement((parser *)&stack0xffffffffffffffc0,SUB81(this,0));
      std::
      vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
      ::emplace_back<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                ((vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                 &stack0xffffffffffffffc0);
      if (local_40 != (element_type *)0x0) {
        (**(code **)(*(long *)local_40 + 8))();
      }
      if ((bVar1 == false) && (this->strict_mode_ == true)) {
        for (puVar7 = (__return_storage_ptr__->
                      super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            puVar7 != (__return_storage_ptr__->
                      super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1; puVar7 = puVar7 + 1) {
          psVar3 = (puVar7->_M_t).
                   super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
                   super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                   super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
          iVar5 = (**(code **)((long)(psVar3->super_syntax_node)._vptr_syntax_node + 0x18))(psVar3);
          if (iVar5 != 4) {
LAB_0017b262:
            __assert_fail("is_directive(**it)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                          ,0x305,"statement_list mjs::parser::parse_statement_list(bool)");
          }
          plVar4 = (long *)psVar3[1].super_syntax_node._vptr_syntax_node;
          iVar5 = (**(code **)(*plVar4 + 0x18))(plVar4);
          if ((iVar5 != 2) || ((int)plVar4[4] != 4)) goto LAB_0017b262;
          check_string_literal
                    (this,(source_extend *)
                          ((long)(puVar7->_M_t).
                                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                 .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl[1].
                                 super_syntax_node._vptr_syntax_node + 8));
        }
      }
    } while ((uVar6 & 1) == 0);
    psVar3 = (__return_storage_ptr__->
             super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    iVar5 = (**(code **)((long)(psVar3->super_syntax_node)._vptr_syntax_node + 0x18))(psVar3);
    uVar6 = 0;
    if (iVar5 == 4) {
      plVar4 = (long *)psVar3[1].super_syntax_node._vptr_syntax_node;
      iVar5 = (**(code **)(*plVar4 + 0x18))(plVar4);
      uVar6 = 0;
      if ((iVar5 == 2) && (uVar6 = local_38, (int)plVar4[4] != 4)) {
        uVar6 = 0;
      }
    }
  } while( true );
}

Assistant:

statement_list parse_statement_list(bool check_for_strict_mode) {
        statement_list l;
        while (current_token() && current_token_type() != token_type::rbrace) {
            const bool strict_mode_active_before = strict_mode_;
            l.push_back(parse_statement(check_for_strict_mode));
            if (!strict_mode_active_before && strict_mode_) {
                // HACK: Strict mode was activated. Now go back and check the string literals before for octal escape sequences.
                for (auto it = l.begin(); it != l.end() - 1; ++it) {
                    assert(is_directive(**it));
                    check_string_literal(static_cast<const expression_statement&>(**it).e().extend());
                }
            }

            // Check if we're still in the directive prologue (ES5.1, 14.1)
            // which is an unbroken sequence of expression statements consisting of just a string literal
            if (check_for_strict_mode && !is_directive(*l.back())) {
                check_for_strict_mode = false;
            }
        }
        return l;
    }